

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O0

void kratos::port_legality_fix(Generator *top)

{
  undefined1 local_58 [8];
  PortLegalityFixVisitor visitor;
  Generator *top_local;
  
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)top;
  PortLegalityFixVisitor::PortLegalityFixVisitor((PortLegalityFixVisitor *)local_58);
  IRVisitor::visit_generator_root_p
            ((IRVisitor *)local_58,
             (Generator *)visitor.super_IRVisitor.visited_._M_h._M_single_bucket);
  PortLegalityFixVisitor::~PortLegalityFixVisitor((PortLegalityFixVisitor *)local_58);
  return;
}

Assistant:

void port_legality_fix(Generator* top) {
    // notice that we're only interested in input ports since the output ports are handled
    // properly in the decouple fix
    PortLegalityFixVisitor visitor;
    visitor.visit_generator_root_p(top);
}